

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe48At0(uint8_t *buf)

{
  return (ulong)*buf |
         (ulong)((uint)buf[1] << 8 | (uint)buf[2] << 0x10) |
         ((ulong)buf[3] | (ulong)((uint)buf[4] << 8 | (uint)buf[5] << 0x10)) << 0x18;
}

Assistant:

std::uint64_t readFlUIntLe48At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[0];
    res &= UINT64_C(0xffffffffffff);
    return res;
}